

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O3

CURLcode imap_done(connectdata *conn,CURLcode status,_Bool premature)

{
  _Bool _Var1;
  Curl_easy *pCVar2;
  undefined4 *puVar3;
  imapstate iVar4;
  
  pCVar2 = conn->data;
  puVar3 = (undefined4 *)(pCVar2->req).protop;
  if (puVar3 == (undefined4 *)0x0) {
    return CURLE_OK;
  }
  if (status == CURLE_OK) {
    status = CURLE_OK;
    if ((((pCVar2->set).connect_only == false) && (*(long *)(puVar3 + 0xe) == 0)) &&
       ((_Var1 = (pCVar2->set).upload, *(long *)(puVar3 + 6) != 0 ||
        (status = CURLE_OK, (_Var1 & 1U) != 0)))) {
      iVar4 = IMAP_FETCH_FINAL;
      if ((_Var1 & 1U) != 0) {
        status = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","");
        if (status != CURLE_OK) goto LAB_00134306;
        iVar4 = IMAP_APPEND_FINAL;
      }
      (conn->proto).imapc.state = iVar4;
      status = imap_block_statemach(conn);
    }
  }
  else {
    Curl_conncontrol(conn,1);
  }
LAB_00134306:
  (*Curl_cfree)(*(void **)(puVar3 + 2));
  *(undefined8 *)(puVar3 + 2) = 0;
  (*Curl_cfree)(*(void **)(puVar3 + 4));
  *(undefined8 *)(puVar3 + 4) = 0;
  (*Curl_cfree)(*(void **)(puVar3 + 6));
  *(undefined8 *)(puVar3 + 6) = 0;
  (*Curl_cfree)(*(void **)(puVar3 + 8));
  *(undefined8 *)(puVar3 + 8) = 0;
  (*Curl_cfree)(*(void **)(puVar3 + 10));
  *(undefined8 *)(puVar3 + 10) = 0;
  (*Curl_cfree)(*(void **)(puVar3 + 0xc));
  *(undefined8 *)(puVar3 + 0xc) = 0;
  (*Curl_cfree)(*(void **)(puVar3 + 0xe));
  *(undefined8 *)(puVar3 + 0xe) = 0;
  (*Curl_cfree)(*(void **)(puVar3 + 0x10));
  *(undefined8 *)(puVar3 + 0x10) = 0;
  *puVar3 = 0;
  return status;
}

Assistant:

static CURLcode imap_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct IMAP *imap = data->req.protop;

  (void)premature;

  if(!imap)
    return CURLE_OK;

  if(status) {
    connclose(conn, "IMAP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && !imap->custom &&
          (imap->uid || data->set.upload)) {
    /* Handle responses after FETCH or APPEND transfer has finished */
    if(!data->set.upload)
      state(conn, IMAP_FETCH_FINAL);
    else {
      /* End the APPEND command first by sending an empty line */
      result = Curl_pp_sendf(&conn->proto.imapc.pp, "%s", "");
      if(!result)
        state(conn, IMAP_APPEND_FINAL);
    }

    /* Run the state-machine

       TODO: when the multi interface is used, this _really_ should be using
       the imap_multi_statemach function but we have no general support for
       non-blocking DONE operations!
    */
    if(!result)
      result = imap_block_statemach(conn);
  }

  /* Cleanup our per-request based variables */
  Curl_safefree(imap->mailbox);
  Curl_safefree(imap->uidvalidity);
  Curl_safefree(imap->uid);
  Curl_safefree(imap->section);
  Curl_safefree(imap->partial);
  Curl_safefree(imap->query);
  Curl_safefree(imap->custom);
  Curl_safefree(imap->custom_params);

  /* Clear the transfer mode for the next request */
  imap->transfer = FTPTRANSFER_BODY;

  return result;
}